

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonTranslateTextToBlob(JsonParse *pParse,u32 i)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  JsonParse *pParse_00;
  size_t sVar10;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar11;
  int nn;
  u32 k_1;
  u8 seenE;
  char cDelim;
  u8 opcode;
  int k;
  u32 iBlob;
  char *z;
  u8 t;
  int x;
  u32 iStart;
  u32 iThis;
  u32 j;
  char c;
  int op;
  undefined7 in_stack_ffffffffffffff88;
  u8 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  u32 in_stack_ffffffffffffff98;
  u8 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_50;
  char local_49;
  uint local_48;
  uint local_30;
  u32 uVar12;
  uint uVar13;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar14;
  char cVar15;
  char cVar16;
  uint local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = CONCAT13(0xaa,in_stack_ffffffffffffffe0);
  lVar2 = in_RDI[2];
LAB_00232e33:
  pParse_00 = (JsonParse *)(ulong)*(byte *)(lVar2 + (ulong)in_ESI);
  switch(pParse_00) {
  case (JsonParse *)0x0:
    local_10 = 0;
    break;
  case (JsonParse *)0x9:
  case (JsonParse *)0xa:
  case (JsonParse *)0xd:
  case (JsonParse *)0x20:
    sVar10 = strspn((char *)(lVar2 + (ulong)(in_ESI + 1)),"\t\n\r ");
    in_ESI = (int)sVar10 + 1 + in_ESI;
    goto LAB_00232e33;
  case (JsonParse *)0xb:
  case (JsonParse *)0xc:
  case (JsonParse *)0x2f:
  case (JsonParse *)0xc2:
  case (JsonParse *)0xe1:
  case (JsonParse *)0xe2:
  case (JsonParse *)0xe3:
  case (JsonParse *)0xef:
    iVar8 = json5Whitespace((char *)(lVar2 + (ulong)in_ESI));
    if (iVar8 != 0) goto code_r0x002341b1;
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xffffffff;
    break;
  case (JsonParse *)0x22:
    goto LAB_002335d9;
  case (JsonParse *)0x27:
    *(undefined1 *)((long)in_RDI + 0x31) = 1;
LAB_002335d9:
    local_49 = '\a';
    cVar16 = *(char *)(lVar2 + (ulong)in_ESI);
    local_10 = in_ESI + 1;
    goto LAB_002335f4;
  case (JsonParse *)0x2b:
    *(undefined1 *)((long)in_RDI + 0x31) = 1;
    goto LAB_00233a8d;
  case (JsonParse *)0x2c:
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xfffffffc;
    break;
  case (JsonParse *)0x2d:
  case (JsonParse *)0x30:
  case (JsonParse *)0x31:
  case (JsonParse *)0x32:
  case (JsonParse *)0x33:
  case (JsonParse *)0x34:
  case (JsonParse *)0x35:
  case (JsonParse *)0x36:
  case (JsonParse *)0x37:
  case (JsonParse *)0x38:
  case (JsonParse *)0x39:
LAB_00233a8d:
    bVar11 = false;
    if (*(char *)(lVar2 + (ulong)in_ESI) < '1') {
      if (*(char *)(lVar2 + (ulong)in_ESI) == '0') {
        if (((*(char *)(lVar2 + (ulong)(in_ESI + 1)) == 'x') ||
            (*(char *)(lVar2 + (ulong)(in_ESI + 1)) == 'X')) &&
           ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 2))] & 8) != 0)) {
          *(undefined1 *)((long)in_RDI + 0x31) = 1;
          local_10 = in_ESI + 3;
          while ((""[*(byte *)(lVar2 + (ulong)local_10)] & 8) != 0) {
            local_10 = local_10 + 1;
          }
          goto LAB_002340a4;
        }
        if ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 1))] & 4) == 0) goto LAB_00233e2c;
        *(uint *)(in_RDI + 5) = in_ESI + 1;
        local_10 = 0xffffffff;
        break;
      }
      if ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 1))] & 4) == 0) {
        if (((*(char *)(lVar2 + (ulong)(in_ESI + 1)) == 'I') ||
            (*(char *)(lVar2 + (ulong)(in_ESI + 1)) == 'i')) &&
           (iVar8 = sqlite3_strnicmp((char *)(lVar2 + (ulong)(in_ESI + 1)),"inf",3), iVar8 == 0)) {
          *(undefined1 *)((long)in_RDI + 0x31) = 1;
          if (*(char *)(lVar2 + (ulong)in_ESI) == '-') {
            jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                               (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                              );
          }
          else {
            jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                               (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                              );
          }
          iVar8 = sqlite3_strnicmp((char *)(lVar2 + (ulong)(in_ESI + 4)),"inity",5);
          iVar9 = 4;
          if (iVar8 == 0) {
            iVar9 = 9;
          }
          local_10 = in_ESI + iVar9;
          break;
        }
        if (*(char *)(lVar2 + (ulong)(in_ESI + 1)) != '.') {
          *(uint *)(in_RDI + 5) = in_ESI;
          local_10 = 0xffffffff;
          break;
        }
        *(undefined1 *)((long)in_RDI + 0x31) = 1;
        bVar11 = false;
      }
      else {
        if (*(char *)(lVar2 + (ulong)(in_ESI + 1)) != '0') goto LAB_00233e2c;
        if ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 2))] & 4) != 0) {
          *(uint *)(in_RDI + 5) = in_ESI + 1;
          local_10 = 0xffffffff;
          break;
        }
        if (((*(char *)(lVar2 + (ulong)(in_ESI + 2)) == 'x') ||
            (*(char *)(lVar2 + (ulong)(in_ESI + 2)) == 'X')) &&
           ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 3))] & 8) != 0)) {
          *(undefined1 *)((long)in_RDI + 0x31) = 1;
          local_10 = in_ESI + 4;
          while ((""[*(byte *)(lVar2 + (ulong)local_10)] & 8) != 0) {
            local_10 = local_10 + 1;
          }
          goto LAB_002340a4;
        }
      }
    }
LAB_00233e2c:
    bVar4 = false;
    uVar13 = in_ESI;
    goto LAB_00233e37;
  case (JsonParse *)0x2e:
    if ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 1))] & 4) != 0) {
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
      bVar11 = true;
      goto LAB_00233e2c;
    }
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xffffffff;
    break;
  case (JsonParse *)0x3a:
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xfffffffb;
    break;
  case (JsonParse *)0x5b:
    jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                       (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    lVar5 = in_RDI[1];
    if (*(char *)((long)in_RDI + 0x2f) == '\0') {
      uVar7 = *(short *)((long)in_RDI + 0x2c) + 1;
      *(ushort *)((long)in_RDI + 0x2c) = uVar7;
      local_10 = in_ESI;
      if (uVar7 < 0x3e9) goto LAB_00233408;
      *(uint *)(in_RDI + 5) = in_ESI;
      local_10 = 0xffffffff;
    }
    else {
      local_10 = 0xffffffff;
    }
    break;
  case (JsonParse *)0x5d:
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xfffffffd;
    break;
  case (JsonParse *)0x66:
    iVar8 = strncmp((char *)(lVar2 + (ulong)in_ESI),"false",5);
    if ((iVar8 == 0) && ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 5))] & 6) == 0)) {
      jsonBlobAppendOneByte
                ((JsonParse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8f);
      local_10 = in_ESI + 5;
    }
    else {
      *(uint *)(in_RDI + 5) = in_ESI;
      local_10 = 0xffffffff;
    }
    break;
  case (JsonParse *)0x6e:
    iVar8 = strncmp((char *)(lVar2 + (ulong)in_ESI),"null",4);
    if ((iVar8 == 0) && ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 4))] & 6) == 0)) {
      jsonBlobAppendOneByte
                ((JsonParse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8f);
      local_10 = in_ESI + 4;
      break;
    }
  default:
    cVar16 = *(char *)(lVar2 + (ulong)in_ESI);
    local_50 = 0;
    goto LAB_00234273;
  case (JsonParse *)0x74:
    iVar8 = strncmp((char *)(lVar2 + (ulong)in_ESI),"true",4);
    if ((iVar8 == 0) && ((""[*(byte *)(lVar2 + (ulong)(in_ESI + 4))] & 6) == 0)) {
      jsonBlobAppendOneByte
                ((JsonParse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8f);
      local_10 = in_ESI + 4;
    }
    else {
      *(uint *)(in_RDI + 5) = in_ESI;
      local_10 = 0xffffffff;
    }
    break;
  case (JsonParse *)0x7b:
    jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                       (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar7 = *(short *)((long)in_RDI + 0x2c) + 1;
    *(ushort *)((long)in_RDI + 0x2c) = uVar7;
    if (1000 < uVar7) {
      *(uint *)(in_RDI + 5) = in_ESI;
      local_10 = 0xffffffff;
      break;
    }
    lVar5 = in_RDI[1];
    local_10 = in_ESI;
    goto LAB_00232edd;
  case (JsonParse *)0x7d:
    *(uint *)(in_RDI + 5) = in_ESI;
    local_10 = 0xfffffffe;
  }
  goto LAB_002343c2;
LAB_00232edd:
  local_10 = local_10 + 1;
  uVar13 = *(uint *)(in_RDI + 1);
  local_30 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),local_10);
  if ((int)local_30 < 1) {
    if (local_30 == 0xfffffffe) {
      local_10 = *(uint *)(in_RDI + 5);
      if ((int)in_RDI[1] != (int)lVar5) {
        *(undefined1 *)((long)in_RDI + 0x31) = 1;
      }
      goto LAB_0023333f;
    }
    iVar8 = json5Whitespace((char *)(lVar2 + (ulong)local_10));
    local_10 = iVar8 + local_10;
    local_48 = local_10;
    if (((""[*(byte *)(lVar2 + (ulong)local_10)] & 0x42) != 0) ||
       ((*(char *)(lVar2 + (ulong)local_10) == '\\' &&
        (iVar8 = jsonIs4HexB((char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                             (int *)0x232fb1), local_48 = local_10, iVar8 != 0)))) {
      do {
        local_48 = local_48 + 1;
        if ((""[*(byte *)(lVar2 + (int)local_48)] & 0x46) == 0) {
LAB_00233007:
          bVar11 = false;
          if (*(char *)(lVar2 + (int)local_48) == '\\') {
            iVar8 = jsonIs4HexB((char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88
                                                ),(int *)0x23303b);
            bVar11 = iVar8 != 0;
          }
        }
        else {
          iVar8 = json5Whitespace((char *)(lVar2 + (int)local_48));
          bVar11 = true;
          if (iVar8 != 0) goto LAB_00233007;
        }
      } while (bVar11);
      jsonBlobAppendNode(pParse_00,'\0',in_stack_ffffffffffffff98,
                         (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
      local_30 = local_48;
      goto LAB_002330c1;
    }
    if (local_30 != 0xffffffff) {
      *(uint *)(in_RDI + 5) = local_10;
    }
    local_10 = 0xffffffff;
  }
  else {
LAB_002330c1:
    if (*(char *)((long)in_RDI + 0x2f) != '\0') {
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    bVar6 = *(byte *)(*in_RDI + (ulong)uVar13) & 0xf;
    if ((bVar6 < 7) || (10 < bVar6)) {
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    if (*(char *)(lVar2 + (ulong)local_30) == ':') {
LAB_002331f5:
      uVar12 = local_30 + 1;
    }
    else {
      if (""[*(byte *)(lVar2 + (ulong)local_30)] == '\0') {
LAB_002331ad:
        iVar8 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),local_30);
        if (iVar8 == -5) {
          local_30 = *(uint *)(in_RDI + 5);
          goto LAB_002331f5;
        }
        if (iVar8 != -1) {
          *(uint *)(in_RDI + 5) = local_30;
        }
        local_10 = 0xffffffff;
        goto LAB_002343c2;
      }
      do {
        uVar13 = local_30;
        local_30 = uVar13 + 1;
      } while (""[*(byte *)(lVar2 + (ulong)local_30)] != '\0');
      if (*(char *)(lVar2 + (ulong)local_30) != ':') goto LAB_002331ad;
      uVar12 = uVar13 + 2;
    }
    local_10 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),uVar12);
    if (0 < (int)local_10) goto LAB_00233230;
    if (local_10 != 0xffffffff) {
      *(u32 *)(in_RDI + 5) = uVar12;
    }
    local_10 = 0xffffffff;
  }
  goto LAB_002343c2;
LAB_00233230:
  if (*(char *)(lVar2 + (ulong)local_10) == ',') goto LAB_00232edd;
  if (*(char *)(lVar2 + (ulong)local_10) != '}') {
    if (""[*(byte *)(lVar2 + (ulong)local_10)] != '\0') {
      sVar10 = strspn((char *)(lVar2 + (ulong)(local_10 + 1)),"\t\n\r ");
      local_10 = (int)sVar10 + 1 + local_10;
      if (*(char *)(lVar2 + (ulong)local_10) == ',') goto LAB_00232edd;
      if (*(char *)(lVar2 + (ulong)local_10) == '}') goto LAB_0023333f;
    }
    iVar8 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),local_10);
    if (iVar8 == -4) {
      local_10 = *(uint *)(in_RDI + 5);
      goto LAB_00232edd;
    }
    if (iVar8 != -2) {
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    local_10 = *(uint *)(in_RDI + 5);
  }
LAB_0023333f:
  jsonBlobChangePayloadSize
            ((JsonParse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (u32)((ulong)pParse_00 >> 0x20),(u32)pParse_00);
  *(short *)((long)in_RDI + 0x2c) = *(short *)((long)in_RDI + 0x2c) + -1;
  local_10 = local_10 + 1;
  goto LAB_002343c2;
LAB_00233408:
  uVar12 = local_10 + 1;
  local_10 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),uVar12);
  if ((int)local_10 < 1) goto code_r0x00233421;
  if (*(char *)(lVar2 + (ulong)local_10) != ',') {
    if (*(char *)(lVar2 + (ulong)local_10) == ']') goto LAB_0023357f;
    if (""[*(byte *)(lVar2 + (ulong)local_10)] != '\0') {
      sVar10 = strspn((char *)(lVar2 + (ulong)(local_10 + 1)),"\t\n\r ");
      local_10 = (int)sVar10 + 1 + local_10;
      if (*(char *)(lVar2 + (ulong)local_10) == ',') goto LAB_00233408;
      if (*(char *)(lVar2 + (ulong)local_10) == ']') goto LAB_0023357f;
    }
    iVar8 = jsonTranslateTextToBlob((JsonParse *)CONCAT44(in_ESI,uVar14),local_10);
    if (iVar8 != -4) {
      if (iVar8 == -3) {
        local_10 = *(uint *)(in_RDI + 5);
        goto LAB_0023357f;
      }
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    local_10 = *(uint *)(in_RDI + 5);
  }
  goto LAB_00233408;
LAB_00233e37:
  do {
    uVar3 = uVar13;
    local_10 = uVar3 + 1;
    bVar6 = *(byte *)(lVar2 + (ulong)local_10);
    uVar13 = local_10;
  } while ((""[bVar6] & 4) != 0);
  if (bVar6 == 0x2e) {
    if (bVar11) {
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    bVar11 = true;
    uVar13 = local_10;
    goto LAB_00233e37;
  }
  if ((bVar6 != 0x65) && (bVar6 != 0x45)) {
    if ('/' < *(char *)(lVar2 + (ulong)uVar3)) goto LAB_002340a4;
    if (((*(char *)(lVar2 + (ulong)uVar3) == '.') && (in_ESI <= uVar3 - 1)) &&
       ((""[*(byte *)(lVar2 + (ulong)(uVar3 - 1))] & 4) != 0)) {
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
LAB_002340a4:
      jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                         (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    else {
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
    }
    goto LAB_002343c2;
  }
  if (*(char *)(lVar2 + (ulong)uVar3) < '0') {
    if (((*(char *)(lVar2 + (ulong)uVar3) != '.') || (uVar3 - 1 < in_ESI)) ||
       ((""[*(byte *)(lVar2 + (ulong)(uVar3 - 1))] & 4) == 0)) {
      *(uint *)(in_RDI + 5) = local_10;
      local_10 = 0xffffffff;
      goto LAB_002343c2;
    }
    *(undefined1 *)((long)in_RDI + 0x31) = 1;
  }
  if (bVar4) {
    *(uint *)(in_RDI + 5) = local_10;
    local_10 = 0xffffffff;
    goto LAB_002343c2;
  }
  bVar11 = true;
  bVar4 = true;
  cVar16 = *(char *)(lVar2 + (ulong)(uVar3 + 2));
  if ((cVar16 == '+') || (cVar16 == '-')) {
    local_10 = uVar3 + 2;
    cVar16 = *(char *)(lVar2 + (ulong)(uVar3 + 3));
  }
  if ((cVar16 < '0') || (uVar13 = local_10, '9' < cVar16)) goto LAB_00233fe1;
  goto LAB_00233e37;
LAB_00233fe1:
  *(uint *)(in_RDI + 5) = local_10;
  local_10 = 0xffffffff;
  goto LAB_002343c2;
LAB_002335f4:
  if (""[*(byte *)(lVar2 + (ulong)local_10)] == '\0') {
LAB_00233680:
    cVar15 = *(char *)(lVar2 + (ulong)local_10);
    if (cVar15 == cVar16) {
      jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                         (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_10 = local_10 + 1;
      goto LAB_002343c2;
    }
    if (cVar15 == '\\') {
      local_10 = local_10 + 1;
      cVar15 = *(char *)(lVar2 + (ulong)local_10);
      if ((((((cVar15 == '\"') || (cVar15 == '\\')) || (cVar15 == '/')) ||
           ((cVar15 == 'b' || (cVar15 == 'f')))) ||
          ((cVar15 == 'n' || ((cVar15 == 'r' || (cVar15 == 't')))))) ||
         ((cVar15 == 'u' &&
          (iVar8 = jsonIs4Hex((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
          , iVar8 != 0)))) {
        if (local_49 == '\a') {
          local_49 = '\b';
        }
      }
      else {
        if (((((cVar15 == '\'') || (cVar15 == '0')) || (cVar15 == 'v')) || (cVar15 == '\n')) ||
           ((((cVar15 == -0x1e && (*(char *)(lVar2 + (ulong)(local_10 + 1)) == -0x80)) &&
             ((*(char *)(lVar2 + (ulong)(local_10 + 2)) == -0x58 ||
              (*(char *)(lVar2 + (ulong)(local_10 + 2)) == -0x57)))) ||
            ((cVar15 == 'x' &&
             (iVar8 = jsonIs2Hex((char *)(lVar2 + (ulong)(local_10 + 1))), iVar8 != 0)))))) {
          *(undefined1 *)((long)in_RDI + 0x31) = 1;
        }
        else {
          if (cVar15 != '\r') {
            *(uint *)(in_RDI + 5) = local_10;
            local_10 = 0xffffffff;
            goto LAB_002343c2;
          }
          if (*(char *)(lVar2 + (ulong)(local_10 + 1)) == '\n') {
            local_10 = local_10 + 1;
          }
          *(undefined1 *)((long)in_RDI + 0x31) = 1;
        }
        local_49 = '\t';
      }
    }
    else if (cVar15 < ' ') {
      if (cVar15 == '\0') goto code_r0x0023388e;
      local_49 = '\t';
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
    }
    else if (cVar15 == '\"') {
      local_49 = '\t';
    }
    local_10 = local_10 + 1;
    goto LAB_002335f4;
  }
  if (""[*(byte *)(lVar2 + (ulong)(local_10 + 1))] == '\0') {
    local_10 = local_10 + 1;
    goto LAB_00233680;
  }
  if (""[*(byte *)(lVar2 + (ulong)(local_10 + 2))] == '\0') {
    local_10 = local_10 + 2;
    goto LAB_00233680;
  }
  local_10 = local_10 + 3;
  goto LAB_002335f4;
code_r0x0023388e:
  *(uint *)(in_RDI + 5) = local_10;
  local_10 = 0xffffffff;
  goto LAB_002343c2;
code_r0x002341b1:
  in_ESI = iVar8 + in_ESI;
  *(undefined1 *)((long)in_RDI + 0x31) = 1;
  goto LAB_00232e33;
LAB_00234273:
  if (4 < local_50) goto LAB_002343ae;
  if ((cVar16 == aNanInfName[local_50].c1) || (cVar16 == aNanInfName[local_50].c2)) {
    iVar8 = (int)aNanInfName[local_50].n;
    iVar9 = sqlite3_strnicmp((char *)(lVar2 + (ulong)in_ESI),aNanInfName[local_50].zMatch,iVar8);
    if ((iVar9 == 0) && ((""[*(byte *)(lVar2 + (ulong)(in_ESI + iVar8))] & 6) == 0)) {
      if (aNanInfName[local_50].eType == '\x05') {
        jsonBlobAppendNode(pParse_00,in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,
                           (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      else {
        jsonBlobAppendOneByte
                  ((JsonParse *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8f);
      }
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
      local_10 = in_ESI + iVar8;
      goto LAB_002343c2;
    }
  }
  local_50 = local_50 + 1;
  goto LAB_00234273;
LAB_002343ae:
  *(uint *)(in_RDI + 5) = in_ESI;
  local_10 = 0xffffffff;
  goto LAB_002343c2;
code_r0x00233421:
  if (local_10 == 0xfffffffd) {
    local_10 = *(uint *)(in_RDI + 5);
    if ((int)in_RDI[1] != (int)lVar5) {
      *(undefined1 *)((long)in_RDI + 0x31) = 1;
    }
LAB_0023357f:
    jsonBlobChangePayloadSize
              ((JsonParse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (u32)((ulong)pParse_00 >> 0x20),(u32)pParse_00);
    *(short *)((long)in_RDI + 0x2c) = *(short *)((long)in_RDI + 0x2c) + -1;
    local_10 = local_10 + 1;
  }
  else {
    if (local_10 != 0xffffffff) {
      *(u32 *)(in_RDI + 5) = uVar12;
    }
    local_10 = 0xffffffff;
  }
LAB_002343c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int jsonTranslateTextToBlob(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  u32 iThis, iStart;
  int x;
  u8 t;
  const char *z = pParse->zJson;
json_parse_restart:
  switch( (u8)z[i] ){
  case '{': {
    /* Parse object */
    iThis = pParse->nBlob;
    jsonBlobAppendNode(pParse, JSONB_OBJECT, pParse->nJson-i, 0);
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    iStart = pParse->nBlob;
    for(j=i+1;;j++){
      u32 iBlob = pParse->nBlob;
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        int op;
        if( x==(-2) ){
          j = pParse->iErr;
          if( pParse->nBlob!=(u32)iStart ) pParse->hasNonstd = 1;
          break;
        }
        j += json5Whitespace(&z[j]);
        op = JSONB_TEXT;
        if( sqlite3JsonId1(z[j])
         || (z[j]=='\\' && jsonIs4HexB(&z[j+1], &op))
        ){
          int k = j+1;
          while( (sqlite3JsonId2(z[k]) && json5Whitespace(&z[k])==0)
            || (z[k]=='\\' && jsonIs4HexB(&z[k+1], &op))
          ){
            k++;
          }
          assert( iBlob==pParse->nBlob );
          jsonBlobAppendNode(pParse, op, k-j, &z[j]);
          pParse->hasNonstd = 1;
          x = k;
        }else{
          if( x!=-1 ) pParse->iErr = j;
          return -1;
        }
      }
      if( pParse->oom ) return -1;
      t = pParse->aBlob[iBlob] & 0x0f;
      if( t<JSONB_TEXT || t>JSONB_TEXTRAW ){
        pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==':' ){
        j++;
      }else{
        if( jsonIsspace(z[j]) ){
          /* strspn() is not helpful here */
          do{ j++; }while( jsonIsspace(z[j]) );
          if( z[j]==':' ){
            j++;
            goto parse_object_value;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x!=(-5) ){
          if( x!=(-1) ) pParse->iErr = j;
          return -1;
        }
        j = pParse->iErr+1;
      }
    parse_object_value:
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]=='}' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]=='}' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-2) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '[': {
    /* Parse array */
    iThis = pParse->nBlob;
    assert( i<=(u32)pParse->nJson );
    jsonBlobAppendNode(pParse, JSONB_ARRAY, pParse->nJson - i, 0);
    iStart = pParse->nBlob;
    if( pParse->oom ) return -1;
    if( ++pParse->iDepth > JSON_MAX_DEPTH ){
      pParse->iErr = i;
      return -1;
    }
    for(j=i+1;;j++){
      x = jsonTranslateTextToBlob(pParse, j);
      if( x<=0 ){
        if( x==(-3) ){
          j = pParse->iErr;
          if( pParse->nBlob!=iStart ) pParse->hasNonstd = 1;
          break;
        }
        if( x!=(-1) ) pParse->iErr = j;
        return -1;
      }
      j = x;
      if( z[j]==',' ){
        continue;
      }else if( z[j]==']' ){
        break;
      }else{
        if( jsonIsspace(z[j]) ){
          j += 1 + (u32)strspn(&z[j+1], jsonSpaces);
          if( z[j]==',' ){
            continue;
          }else if( z[j]==']' ){
            break;
          }
        }
        x = jsonTranslateTextToBlob(pParse, j);
        if( x==(-4) ){
          j = pParse->iErr;
          continue;
        }
        if( x==(-3) ){
          j = pParse->iErr;
          break;
        }
      }
      pParse->iErr = j;
      return -1;
    }
    jsonBlobChangePayloadSize(pParse, iThis, pParse->nBlob - iStart);
    pParse->iDepth--;
    return j+1;
  }
  case '\'': {
    u8 opcode;
    char cDelim;
    pParse->hasNonstd = 1;
    opcode = JSONB_TEXT;
    goto parse_string;
  case '"':
    /* Parse string */
    opcode = JSONB_TEXT;
  parse_string:
    cDelim = z[i];
    j = i+1;
    while( 1 /*exit-by-break*/ ){
      if( jsonIsOk[(u8)z[j]] ){
        if( !jsonIsOk[(u8)z[j+1]] ){
          j += 1;
        }else if( !jsonIsOk[(u8)z[j+2]] ){
          j += 2;
        }else{
          j += 3;
          continue;
        }
      }
      c = z[j];
      if( c==cDelim ){
        break;
      }else if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(&z[j+1])) ){
          if( opcode==JSONB_TEXT ) opcode = JSONB_TEXTJ;
        }else if( c=='\'' || c=='0' || c=='v' || c=='\n'
           || (0xe2==(u8)c && 0x80==(u8)z[j+1]
                && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2]))
           || (c=='x' && jsonIs2Hex(&z[j+1])) ){
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else if( c=='\r' ){
          if( z[j+1]=='\n' ) j++;
          opcode = JSONB_TEXT5;
          pParse->hasNonstd = 1;
        }else{
          pParse->iErr = j;
          return -1;
        }
      }else if( c<=0x1f ){
        if( c==0 ){
          pParse->iErr = j;
          return -1;
        }
        /* Control characters are not allowed in canonical JSON string
        ** literals, but are allowed in JSON5 string literals. */
        opcode = JSONB_TEXT5;
        pParse->hasNonstd = 1;
      }else if( c=='"' ){
        opcode = JSONB_TEXT5;
      }
      j++;
    }
    jsonBlobAppendNode(pParse, opcode, j-1-i, &z[i+1]);
    return j+1;
  }
  case 't': {
    if( strncmp(z+i,"true",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_TRUE);
      return i+4;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'f': {
    if( strncmp(z+i,"false",5)==0 && !sqlite3Isalnum(z[i+5]) ){
      jsonBlobAppendOneByte(pParse, JSONB_FALSE);
      return i+5;
    }
    pParse->iErr = i;
    return -1;
  }
  case '+': {
    u8 seenE;
    pParse->hasNonstd = 1;
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
    goto parse_number;
  case '.':
    if( sqlite3Isdigit(z[i+1]) ){
      pParse->hasNonstd = 1;
      t = 0x03;          /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
      seenE = 0;
      goto parse_number_2;
    }
    pParse->iErr = i;
    return -1;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    /* Parse number */
    t = 0x00;            /* Bit 0x01:  JSON5.   Bit 0x02:  FLOAT */
  parse_number:
    seenE = 0;
    assert( '-' < '0' );
    assert( '+' < '0' );
    assert( '.' < '0' );
    c = z[i];

    if( c<='0' ){
      if( c=='0' ){
        if( (z[i+1]=='x' || z[i+1]=='X') && sqlite3Isxdigit(z[i+2]) ){
          assert( t==0x00 );
          pParse->hasNonstd = 1;
          t = 0x01;
          for(j=i+3; sqlite3Isxdigit(z[j]); j++){}
          goto parse_number_finish;
        }else if( sqlite3Isdigit(z[i+1]) ){
          pParse->iErr = i+1;
          return -1;
        }
      }else{
        if( !sqlite3Isdigit(z[i+1]) ){
          /* JSON5 allows for "+Infinity" and "-Infinity" using exactly
          ** that case.  SQLite also allows these in any case and it allows
          ** "+inf" and "-inf". */
          if( (z[i+1]=='I' || z[i+1]=='i')
           && sqlite3StrNICmp(&z[i+1], "inf",3)==0
          ){
            pParse->hasNonstd = 1;
            if( z[i]=='-' ){
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 6, "-9e999");
            }else{
              jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
            }
            return i + (sqlite3StrNICmp(&z[i+4],"inity",5)==0 ? 9 : 4);
          }
          if( z[i+1]=='.' ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            goto parse_number_2;
          }
          pParse->iErr = i;
          return -1;
        }
        if( z[i+1]=='0' ){
          if( sqlite3Isdigit(z[i+2]) ){
            pParse->iErr = i+1;
            return -1;
          }else if( (z[i+2]=='x' || z[i+2]=='X') && sqlite3Isxdigit(z[i+3]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
            for(j=i+4; sqlite3Isxdigit(z[j]); j++){}
            goto parse_number_finish;
          }
        }
      }
    }

  parse_number_2:
    for(j=i+1;; j++){
      c = z[j];
      if( sqlite3Isdigit(c) ) continue;
      if( c=='.' ){
        if( (t & 0x02)!=0 ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ){
          if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
            pParse->hasNonstd = 1;
            t |= 0x01;
          }else{
            pParse->iErr = j;
            return -1;
          }
        }
        if( seenE ){
          pParse->iErr = j;
          return -1;
        }
        t |= 0x02;
        seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ){
          pParse->iErr = j;
          return -1;
        }
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ){
      if( ALWAYS(z[j-1]=='.') && ALWAYS(j-2>=i) && sqlite3Isdigit(z[j-2]) ){
        pParse->hasNonstd = 1;
        t |= 0x01;
      }else{
        pParse->iErr = j;
        return -1;
      }
    }
  parse_number_finish:
    assert( JSONB_INT+0x01==JSONB_INT5 );
    assert( JSONB_FLOAT+0x01==JSONB_FLOAT5 );
    assert( JSONB_INT+0x02==JSONB_FLOAT );
    if( z[i]=='+' ) i++;
    jsonBlobAppendNode(pParse, JSONB_INT+t, j-i, &z[i]);
    return j;
  }
  case '}': {
    pParse->iErr = i;
    return -2;  /* End of {...} */
  }
  case ']': {
    pParse->iErr = i;
    return -3;  /* End of [...] */
  }
  case ',': {
    pParse->iErr = i;
    return -4;  /* List separator */
  }
  case ':': {
    pParse->iErr = i;
    return -5;  /* Object label/value separator */
  }
  case 0: {
    return 0;   /* End of file */
  }
  case 0x09:
  case 0x0a:
  case 0x0d:
  case 0x20: {
    i += 1 + (u32)strspn(&z[i+1], jsonSpaces);
    goto json_parse_restart;
  }
  case 0x0b:
  case 0x0c:
  case '/':
  case 0xc2:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xef: {
    j = json5Whitespace(&z[i]);
    if( j>0 ){
      i += j;
      pParse->hasNonstd = 1;
      goto json_parse_restart;
    }
    pParse->iErr = i;
    return -1;
  }
  case 'n': {
    if( strncmp(z+i,"null",4)==0 && !sqlite3Isalnum(z[i+4]) ){
      jsonBlobAppendOneByte(pParse, JSONB_NULL);
      return i+4;
    }
    /* fall-through into the default case that checks for NaN */
    /* no break */ deliberate_fall_through
  }
  default: {
    u32 k;
    int nn;
    c = z[i];
    for(k=0; k<sizeof(aNanInfName)/sizeof(aNanInfName[0]); k++){
      if( c!=aNanInfName[k].c1 && c!=aNanInfName[k].c2 ) continue;
      nn = aNanInfName[k].n;
      if( sqlite3StrNICmp(&z[i], aNanInfName[k].zMatch, nn)!=0 ){
        continue;
      }
      if( sqlite3Isalnum(z[i+nn]) ) continue;
      if( aNanInfName[k].eType==JSONB_FLOAT ){
        jsonBlobAppendNode(pParse, JSONB_FLOAT, 5, "9e999");
      }else{
        jsonBlobAppendOneByte(pParse, JSONB_NULL);
      }
      pParse->hasNonstd = 1;
      return i + nn;
    }
    pParse->iErr = i;
    return -1;  /* Syntax error */
  }
  } /* End switch(z[i]) */
}